

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O1

int AF_AActor_VelFromAngle
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  AActor *this;
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  PClass *pPVar3;
  char *__assertion;
  bool bVar4;
  DAngle local_28;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      this = (AActor *)(param->field_0).field_1.a;
      if (this != (AActor *)0x0) {
        if ((this->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar2 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
          (this->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar2);
        }
        pPVar3 = (this->super_DThinker).super_DObject.Class;
        bVar4 = pPVar3 != (PClass *)0x0;
        if (pPVar3 != pPVar1 && bVar4) {
          do {
            pPVar3 = pPVar3->ParentClass;
            bVar4 = pPVar3 != (PClass *)0x0;
            if (pPVar3 == pPVar1) break;
          } while (pPVar3 != (PClass *)0x0);
        }
        if (!bVar4) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_00434b5d;
        }
      }
      if (numparam == 1) {
        AActor::VelFromAngle(this);
      }
      else {
        if (param[1].field_0.field_3.Type != '\x01') {
          __assert_fail("param[paramnum].Type == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                        ,0x1de7,
                        "int AF_AActor_VelFromAngle(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        if (numparam == 2) {
          AActor::VelFromAngle(this,param[1].field_0.f);
        }
        else {
          if (param[2].field_0.field_3.Type != '\x01') {
            __assert_fail("param[paramnum].Type == REGT_FLOAT",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                          ,0x1dee,
                          "int AF_AActor_VelFromAngle(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          local_28.Degrees = (double)param[2].field_0.field_1.a;
          AActor::VelFromAngle(this,param[1].field_0.f,&local_28);
        }
      }
      return 0;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_00434b5d:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                ,0x1de0,
                "int AF_AActor_VelFromAngle(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, VelFromAngle)
{
	PARAM_SELF_PROLOGUE(AActor);
	if (numparam == 1)
	{
		self->VelFromAngle();
	}
	else
	{
		PARAM_FLOAT(speed);
		if (numparam == 2)
		{
			self->VelFromAngle(speed);
		}
		else
		{
			PARAM_ANGLE(angle);
			self->VelFromAngle(speed, angle);
		}
	}
	return 0;
}